

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  byte bVar4;
  error_category *peVar5;
  undefined1 *puVar6;
  error_code tec;
  file_status fs;
  path folders;
  iterator __begin2;
  string_type part;
  error_code tmp_ec;
  path current;
  iterator __end2;
  file_status local_160;
  error_category *peStack_158;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined8 uStack_120;
  undefined1 local_118 [8];
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  const_iterator local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  char local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  file_status local_a8;
  error_category *local_a0;
  path local_98;
  iterator local_78;
  
  local_98._path._M_dataplus._M_p = (pointer)&local_98._path.field_2;
  local_98._path._M_string_length = 0;
  local_98._path.field_2._M_local_buf[0] = '\0';
  peVar5 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar5;
  path::root_name_length(p);
  path::root_name_length(p);
  std::__cxx11::string::substr((ulong)local_110,(ulong)p);
  path::operator=(&local_98,(string_type *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  std::__cxx11::string::substr((ulong)local_110,(ulong)p);
  local_140._8_8_ = local_130 + 8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ == &local_100) {
    uStack_120 = local_100._8_8_;
  }
  else {
    local_140._8_8_ = local_110._0_8_;
  }
  local_130._0_8_ = local_110._8_8_;
  local_110._8_8_ = (char *)0x0;
  local_100._M_local_buf[0] = '\0';
  local_110._0_8_ = &local_100;
  path::postprocess_path_with_format((path *)(local_140 + 8),(format)p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  local_78._first._M_current = (char *)local_140._8_8_;
  path::iterator::iterator((iterator *)local_110,(path *)(local_140 + 8),&local_78._first);
  local_160 = (file_status)(local_140._8_8_ + local_130._0_8_);
  path::iterator::iterator(&local_78,(path *)(local_140 + 8),(const_iterator *)&local_160);
  bVar4 = 0;
  while (cVar3._M_current = local_78._iter._M_current, cVar2._M_current = local_f0._M_current,
        local_f0._M_current != local_78._iter._M_current) {
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_e8._M_p,local_e8._M_p + local_e0);
    local_160 = (file_status)local_150;
    puVar6 = local_c8;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_160,local_c8,local_c8 + local_c0);
    path::postprocess_path_with_format((path *)&local_160,(format)puVar6);
    path::operator/=(&local_98,(path *)&local_160);
    if (local_160 != (file_status)local_150) {
      operator_delete((void *)local_160);
    }
    local_160 = (file_status)((ulong)local_160 & 0xffffffff00000000);
    peStack_158 = peVar5;
    detail::status_ex((path *)local_140,(error_code *)&local_98,&local_160,(uintmax_t *)0x0,
                      (uintmax_t *)0x0,(time_t *)0x0,0);
    if ((local_160._type == none) || (local_140._0_4_ == 1)) {
      if ((uint)local_140._0_4_ < 2) {
        create_directory(&local_98,ec);
        if (ec->_M_value != 0) {
          local_a8._type = none;
          local_a0 = peVar5;
          detail::status_ex((path *)local_118,(error_code *)&local_98,&local_a8,(uintmax_t *)0x0,
                            (uintmax_t *)0x0,(time_t *)0x0,0);
          if (local_118._0_4_ != 3) goto LAB_001b10ac;
          ec->_M_value = 0;
          ec->_M_cat = peVar5;
        }
        bVar1 = true;
        bVar4 = 1;
      }
      else {
        bVar1 = true;
        if (local_140._0_4_ != 3) {
          ec->_M_value = 0x11;
          ec->_M_cat = peVar5;
          goto LAB_001b10ac;
        }
      }
    }
    else {
      ec->_M_value = local_160._type;
      *(perms *)&ec->field_0x4 = local_160._perms;
      *(undefined2 *)&ec->field_0x6 = local_160._6_2_;
      ec->_M_cat = peStack_158;
LAB_001b10ac:
      bVar1 = false;
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (!bVar1) break;
    path::iterator::operator++((iterator *)local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
    operator_delete(local_78._current._path._M_dataplus._M_p);
  }
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_130 + 8)) {
    operator_delete((void *)local_140._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._path._M_dataplus._M_p != &local_98._path.field_2) {
    operator_delete(local_98._path._M_dataplus._M_p);
  }
  return (bool)(cVar2._M_current == cVar3._M_current & bVar4);
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    auto rootPathLen = p._prefixLength + p.root_name_length() + (p.has_root_directory() ? 1 : 0);
    current = p.native().substr(0, rootPathLen);
    path folders(p._path.substr(rootPathLen));
    for (path::string_type part : folders) {
        current /= part;
        std::error_code tec;
        auto fs = status(current, tec);
        if (tec && fs.type() != file_type::not_found) {
            ec = tec;
            return false;
        }
        if (!exists(fs)) {
            create_directory(current, ec);
            if (ec) {
                std::error_code tmp_ec;
                if (is_directory(current, tmp_ec)) {
                    ec.clear();
                }
                else {
                    return false;
                }
            }
            didCreate = true;
        }
#ifndef LWG_2935_BEHAVIOUR
        else if (!is_directory(fs)) {
            ec = detail::make_error_code(detail::portable_error::exists);
            return false;
        }
#endif
    }
    return didCreate;
}